

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::rehash(raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
         *this,size_t n)

{
  unsigned_long *puVar1;
  size_t local_28;
  size_t local_20;
  size_t m;
  size_t n_local;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  *this_local;
  
  if ((n != 0) || (this->capacity_ != 0)) {
    m = n;
    n_local = (size_t)this;
    if ((n == 0) && (this->size_ == 0)) {
      destroy_slots(this);
      HashtablezInfoHandle::RecordStorageChanged((HashtablezInfoHandle *)&this->field_0x20,0,0);
    }
    else {
      local_28 = size(this);
      puVar1 = std::max<unsigned_long>(&m,&local_28);
      local_20 = NormalizeCapacity(*puVar1);
      if ((m == 0) || (this->capacity_ < local_20)) {
        resize(this,local_20);
      }
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
        if (n == 0 && capacity_ == 0) return;
        if (n == 0 && size_ == 0) {
            destroy_slots();
            infoz_.RecordStorageChanged(0, 0);
            return;
        }
        // bitor is a faster way of doing `max` here. We will round up to the next
        // power-of-2-minus-1, so bitor is good enough.
        auto m = NormalizeCapacity((std::max)(n, size()));
        // n == 0 unconditionally rehashes as per the standard.
        if (n == 0 || m > capacity_) {
            resize(m);
        }
    }